

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O0

int ssl_buffer_make_space(mbedtls_ssl_context *ssl,size_t desired)

{
  mbedtls_ssl_handshake_params *pmVar1;
  mbedtls_ssl_handshake_params *hs;
  int offset;
  size_t desired_local;
  mbedtls_ssl_context *ssl_local;
  
  pmVar1 = ssl->handshake;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0x10d4,"Attempt to free buffered messages to have %u bytes available",
             desired & 0xffffffff);
  ssl_free_buffered_record(ssl);
  if (0x8000 - (pmVar1->buffering).total_bytes_buffered < desired) {
    for (hs._4_4_ = 3; -1 < (int)hs._4_4_; hs._4_4_ = hs._4_4_ - 1) {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0x10e8,
                 "Free buffering slot %d to make space for reassembly of next handshake message",
                 (ulong)hs._4_4_);
      ssl_buffering_free_slot(ssl,(uint8_t)hs._4_4_);
      if (desired <= 0x8000 - (pmVar1->buffering).total_bytes_buffered) {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0x10ef,"Enough space available after freeing buffered HS messages");
        return 0;
      }
    }
    ssl_local._4_4_ = -1;
  }
  else {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0x10dc,"Enough space available after freeing future epoch record");
    ssl_local._4_4_ = 0;
  }
  return ssl_local._4_4_;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_buffer_make_space(mbedtls_ssl_context *ssl,
                                 size_t desired)
{
    int offset;
    mbedtls_ssl_handshake_params * const hs = ssl->handshake;
    MBEDTLS_SSL_DEBUG_MSG(2, ("Attempt to free buffered messages to have %u bytes available",
                              (unsigned) desired));

    /* Get rid of future records epoch first, if such exist. */
    ssl_free_buffered_record(ssl);

    /* Check if we have enough space available now. */
    if (desired <= (MBEDTLS_SSL_DTLS_MAX_BUFFERING -
                    hs->buffering.total_bytes_buffered)) {
        MBEDTLS_SSL_DEBUG_MSG(2, ("Enough space available after freeing future epoch record"));
        return 0;
    }

    /* We don't have enough space to buffer the next expected handshake
     * message. Remove buffers used for future messages to gain space,
     * starting with the most distant one. */
    for (offset = MBEDTLS_SSL_MAX_BUFFERED_HS - 1;
         offset >= 0; offset--) {
        MBEDTLS_SSL_DEBUG_MSG(2,
                              (
                                  "Free buffering slot %d to make space for reassembly of next handshake message",
                                  offset));

        ssl_buffering_free_slot(ssl, (uint8_t) offset);

        /* Check if we have enough space available now. */
        if (desired <= (MBEDTLS_SSL_DTLS_MAX_BUFFERING -
                        hs->buffering.total_bytes_buffered)) {
            MBEDTLS_SSL_DEBUG_MSG(2, ("Enough space available after freeing buffered HS messages"));
            return 0;
        }
    }

    return -1;
}